

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__write_callbacks(uv_stream_t *stream)

{
  QUEUE *q_1;
  QUEUE pq;
  QUEUE *q;
  uv_write_t *req;
  uv_stream_t *stream_local;
  
  if (stream->write_completed_queue == (void **)stream->write_completed_queue[0]) {
    FUN_0071cf21();
    return;
  }
  if (stream->write_completed_queue == (void **)stream->write_completed_queue[0]) {
    q_1 = (QUEUE *)&q_1;
    pq[0] = &q_1;
  }
  else {
    q_1 = (QUEUE *)stream->write_completed_queue[0];
    pq[0] = stream->write_completed_queue[1];
    *(QUEUE ***)pq[0] = &q_1;
    stream->write_completed_queue[1] = (*q_1)[1];
    *(void ***)stream->write_completed_queue[1] = stream->write_completed_queue;
    (*q_1)[1] = &q_1;
  }
  FUN_0071ce14();
  return;
}

Assistant:

static void uv__write_callbacks(uv_stream_t* stream) {
  uv_write_t* req;
  QUEUE* q;
  QUEUE pq;

  if (QUEUE_EMPTY(&stream->write_completed_queue))
    return;

  QUEUE_MOVE(&stream->write_completed_queue, &pq);

  while (!QUEUE_EMPTY(&pq)) {
    /* Pop a req off write_completed_queue. */
    q = QUEUE_HEAD(&pq);
    req = QUEUE_DATA(q, uv_write_t, queue);
    QUEUE_REMOVE(q);
    uv__req_unregister(stream->loop, req);

    if (req->bufs != NULL) {
      stream->write_queue_size -= uv__write_req_size(req);
      if (req->bufs != req->bufsml)
        uv__free(req->bufs);
      req->bufs = NULL;
    }

    /* NOTE: call callback AFTER freeing the request data. */
    if (req->cb)
      req->cb(req, req->error);
  }
}